

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffpktp(fitsfile *fptr,char *filename,int *status)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  int keytype;
  char keyname [75];
  char newname [75];
  char card [81];
  char cStack_d9;
  char template [161];
  
  if (0 < *status) {
    return *status;
  }
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    ffpmsg("ffpktp could not open the following template file:");
    ffpmsg(filename);
    *status = 0x68;
    iVar1 = 0x68;
  }
  else {
    while (pcVar2 = fgets(template,0xa0,__stream), pcVar2 != (char *)0x0) {
      template[0xa0] = '\0';
      sVar3 = strlen(template);
      template[sVar3 - 1] = '\0';
      iVar1 = ffgthd(template,card,&keytype,status);
      if (0 < iVar1) break;
      strncpy(keyname,card,8);
      keyname[8] = '\0';
      switch(keytype) {
      case 0:
        ffucrd(fptr,keyname,card,status);
        break;
      case 1:
        ffprec(fptr,card,status);
        break;
      case -2:
        strncpy(newname,card + 0x28,8);
        newname[8] = '\0';
        ffmnam(fptr,keyname,newname,status);
        break;
      case -1:
        ffdkey(fptr,keyname,status);
        break;
      default:
        goto switchD_001e562e_default;
      }
    }
switchD_001e562e_default:
    fclose(__stream);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffpktp(fitsfile *fptr,       /* I - FITS file pointer       */
           const char *filename, /* I - name of template file   */
           int *status)          /* IO - error status           */
/*
  read keywords from template file and append to the FITS file
*/
{
    FILE *diskfile;
    char card[FLEN_CARD], template[161];
    char keyname[FLEN_KEYWORD], newname[FLEN_KEYWORD];
    int keytype;
    size_t slen;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    diskfile = fopen(filename,"r"); 
    if (!diskfile)          /* couldn't open file */
    {
            ffpmsg("ffpktp could not open the following template file:");
            ffpmsg(filename);
            return(*status = FILE_NOT_OPENED); 
    }

    while (fgets(template, 160, diskfile) )  /* get next template line */
    {
      template[160] = '\0';      /* make sure string is terminated */
      slen = strlen(template);   /* get string length */
      template[slen - 1] = '\0';  /* over write the 'newline' char */

      if (ffgthd(template, card, &keytype, status) > 0) /* parse template */
         break;

      strncpy(keyname, card, 8);
      keyname[8] = '\0';

      if (keytype == -2)            /* rename the card */
      {
         strncpy(newname, &card[40], 8);
         newname[8] = '\0';

         ffmnam(fptr, keyname, newname, status); 
      }
      else if (keytype == -1)      /* delete the card */
      {
         ffdkey(fptr, keyname, status);
      }
      else if (keytype == 0)       /* update the card */
      {
         ffucrd(fptr, keyname, card, status);
      }
      else if (keytype == 1)      /* append the card */
      {
         ffprec(fptr, card, status);
      }
      else    /* END card; stop here */
      {
         break; 
      }
    }

    fclose(diskfile);   /* close the template file */
    return(*status);
}